

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

Result ONX_ModelTest::ResultFromErrorCounter(ONX_ErrorCounter error_count,Result no_errors_result)

{
  uint uVar1;
  Result local_9;
  Result no_errors_result_local;
  
  uVar1 = ONX_ErrorCounter::FailureCount(&error_count);
  if (uVar1 == 0) {
    uVar1 = ONX_ErrorCounter::ErrorCount(&error_count);
    if (uVar1 == 0) {
      uVar1 = ONX_ErrorCounter::WarningCount(&error_count);
      local_9 = no_errors_result;
      if (uVar1 != 0) {
        local_9 = Warnings;
      }
    }
    else {
      local_9 = Errors;
    }
  }
  else {
    local_9 = Fail;
  }
  return local_9;
}

Assistant:

ONX_ModelTest::Result ONX_ModelTest::ResultFromErrorCounter(
  ONX_ErrorCounter error_count,
  ONX_ModelTest::Result no_errors_result
)
{
  if (error_count.FailureCount() > 0)
    return ONX_ModelTest::Result::Fail;
  if (error_count.ErrorCount() > 0)
    return ONX_ModelTest::Result::Errors;
  if (error_count.WarningCount() > 0)
    return ONX_ModelTest::Result::Warnings;
  return no_errors_result;
}